

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_cpio_binary.c
# Opt level: O3

int write_header(archive_write *a,archive_entry *entry)

{
  la_int64_t *plVar1;
  size_t sVar2;
  wchar_t wVar3;
  uint uVar4;
  uint uVar5;
  mode_t mVar6;
  int iVar7;
  archive_string_conv *sc;
  int *piVar8;
  char *pcVar9;
  dev_t dVar10;
  la_int64_t lVar11;
  uint *puVar12;
  void *pvVar13;
  ulong uVar14;
  dev_t dVar15;
  size_t length;
  char *pcVar16;
  ulong uVar17;
  int iVar18;
  ulong uVar19;
  long lVar20;
  size_t len;
  char *p;
  char *path;
  char h [76];
  int local_bc;
  size_t local_b0;
  size_t local_a8;
  archive_string_conv *local_a0;
  char *local_98;
  char *local_90;
  char local_88 [88];
  
  plVar1 = (la_int64_t *)a->format_data;
  sc = get_sconv(a);
  wVar3 = _archive_entry_pathname_l(entry,&local_90,&local_b0,sc);
  uVar4 = 0;
  local_bc = 0;
  if (wVar3 == L'\0') {
LAB_0057cdb7:
    local_a8 = local_b0;
    local_88[0] = '\0';
    local_88[1] = '\0';
    local_88[2] = '\0';
    local_88[3] = '\0';
    local_88[4] = '\0';
    local_88[5] = '\0';
    local_88[6] = '\0';
    local_88[7] = '\0';
    local_88[8] = '\0';
    local_88[9] = '\0';
    local_88[10] = '\0';
    local_88[0xb] = '\0';
    local_88[0xc] = '\0';
    local_88[0xd] = '\0';
    local_88[0xe] = '\0';
    local_88[0xf] = '\0';
    local_88[0x10] = '\0';
    local_88[0x11] = '\0';
    local_88[0x12] = '\0';
    local_88[0x13] = '\0';
    local_88[0x14] = '\0';
    local_88[0x15] = '\0';
    local_88[0x16] = '\0';
    local_88[0x17] = '\0';
    local_88[0x18] = '\0';
    local_88[0x19] = '\0';
    local_88[0x1a] = '\0';
    local_88[0x1b] = '\0';
    local_88[0x1c] = '\0';
    local_88[0x1d] = '\0';
    local_88[0x1e] = '\0';
    local_88[0x1f] = '\0';
    local_88[0x20] = '\0';
    local_88[0x21] = '\0';
    local_88[0x22] = '\0';
    local_88[0x23] = '\0';
    local_88[0x24] = '\0';
    local_88[0x25] = '\0';
    local_88[0x26] = '\0';
    local_88[0x27] = '\0';
    local_88[0x28] = '\0';
    local_88[0x29] = '\0';
    local_88[0x2a] = '\0';
    local_88[0x2b] = '\0';
    local_88[0x2c] = '\0';
    local_88[0x2d] = '\0';
    local_88[0x2e] = '\0';
    local_88[0x2f] = '\0';
    local_88[0x30] = '\0';
    local_88[0x31] = '\0';
    local_88[0x32] = '\0';
    local_88[0x33] = '\0';
    local_88[0x34] = '\0';
    local_88[0x35] = '\0';
    local_88[0x36] = '\0';
    local_88[0x37] = '\0';
    local_88[0x38] = '\0';
    local_88[0x39] = '\0';
    local_88[0x3a] = '\0';
    local_88[0x3b] = '\0';
    local_88[0x3c] = '\0';
    local_88[0x3d] = '\0';
    local_88[0x3e] = '\0';
    local_88[0x3f] = '\0';
    local_88[0x40] = '\0';
    local_88[0x41] = '\0';
    local_88[0x42] = '\0';
    local_88[0x43] = '\0';
    local_88[0x44] = '\0';
    local_88[0x45] = '\0';
    local_88[0x46] = '\0';
    local_88[0x47] = '\0';
    local_88[0x48] = '\0';
    local_88[0x49] = '\0';
    local_88[0x4a] = '\0';
    local_88[0x4b] = '\0';
    local_a0 = sc;
    format_octal_recursive(0x71c7,local_88,6);
    dVar10 = archive_entry_dev(entry);
    if (0x3fffe < dVar10) {
      dVar10 = 0x3ffff;
    }
    format_octal_recursive(dVar10,local_88 + 6,6);
    lVar11 = archive_entry_ino64(entry);
    if (lVar11 == 0) {
LAB_0057cf1c:
      format_octal_recursive((ulong)uVar4,local_88 + 0xc,6);
      uVar4 = archive_entry_mode(entry);
      if (0x3fffe < uVar4) {
        uVar4 = 0x3ffff;
      }
      format_octal_recursive((ulong)uVar4,local_88 + 0x12,6);
      uVar14 = archive_entry_uid(entry);
      if (0x3fffe < uVar14) {
        uVar14 = 0x3ffff;
      }
      format_octal_recursive(uVar14,local_88 + 0x18,6);
      uVar17 = archive_entry_gid(entry);
      uVar14 = 0x3ffff;
      if (uVar17 < 0x3ffff) {
        uVar14 = uVar17;
      }
      format_octal_recursive(uVar14,local_88 + 0x1e,6);
      uVar5 = archive_entry_nlink(entry);
      uVar4 = 0x3ffff;
      if (uVar5 < 0x3ffff) {
        uVar4 = uVar5;
      }
      format_octal_recursive((ulong)uVar4,local_88 + 0x24,6);
      mVar6 = archive_entry_filetype(entry);
      if ((mVar6 == 0x6000) || (mVar6 = archive_entry_filetype(entry), mVar6 == 0x2000)) {
        dVar15 = archive_entry_rdev(entry);
        dVar10 = 0x3ffff;
        if (dVar15 < 0x3ffff) {
          dVar10 = dVar15;
        }
      }
      else {
        dVar10 = 0;
      }
      format_octal_recursive(dVar10,local_88 + 0x2a,6);
      sVar2 = local_a8;
      uVar14 = archive_entry_mtime(entry);
      if (0x1fffffffe < uVar14) {
        uVar14 = 0x1ffffffff;
      }
      format_octal_recursive(uVar14,local_88 + 0x30,0xb);
      uVar17 = (ulong)((int)sVar2 + 1);
      uVar14 = 0x3ffff;
      if (uVar17 < 0x3ffff) {
        uVar14 = uVar17;
      }
      format_octal_recursive(uVar14,local_88 + 0x3b,6);
      mVar6 = archive_entry_filetype(entry);
      if (mVar6 != 0x8000) {
        archive_entry_set_size(entry,0);
      }
      wVar3 = _archive_entry_symlink_l(entry,&local_98,&local_b0,local_a0);
      if (wVar3 != L'\0') {
        piVar8 = __errno_location();
        if (*piVar8 == 0xc) {
          pcVar16 = "Can\'t allocate memory for Linkname";
          goto LAB_0057d0a3;
        }
        pcVar16 = archive_entry_symlink(entry);
        pcVar9 = archive_string_conversion_charset_name(local_a0);
        archive_set_error(&a->archive,0x54,"Can\'t translate linkname \'%s\' to %s",pcVar16,pcVar9);
        local_bc = -0x14;
      }
      if ((local_98 == (char *)0x0 || local_b0 == 0) || (*local_98 == '\0')) {
        uVar14 = archive_entry_size(entry);
      }
      else {
        uVar14 = strlen(local_98);
      }
      uVar19 = 0x1ffffffff;
      if (uVar14 < 0x1ffffffff) {
        uVar19 = uVar14;
      }
      format_octal_recursive(uVar19,local_88 + 0x41,0xb);
      if (uVar14 >> 0x21 == 0) {
        iVar7 = __archive_write_output(a,local_88,0x4c);
        iVar18 = -0x1e;
        if ((iVar7 == 0) && (iVar7 = __archive_write_output(a,local_90,uVar17), iVar7 == 0)) {
          lVar11 = archive_entry_size(entry);
          *plVar1 = lVar11;
          iVar18 = local_bc;
          if ((local_98 != (char *)0x0) && (*local_98 != '\0')) {
            length = strlen(local_98);
            iVar7 = __archive_write_output(a,local_98,length);
            iVar18 = -0x1e;
            if (iVar7 == 0) {
              iVar18 = local_bc;
            }
          }
        }
      }
      else {
        archive_set_error(&a->archive,0x22,"File is too large for cpio format.");
        iVar18 = -0x19;
      }
      goto LAB_0057d0b7;
    }
    uVar4 = archive_entry_nlink(entry);
    if (1 < uVar4) {
      uVar14 = plVar1[4];
      if (uVar14 != 0) {
        puVar12 = (uint *)(plVar1[2] + 8);
        uVar17 = uVar14;
        do {
          if (*(long *)(puVar12 + -2) == lVar11) {
            uVar17 = (ulong)*puVar12;
            goto LAB_0057cef5;
          }
          puVar12 = puVar12 + 4;
          uVar17 = uVar17 - 1;
        } while (uVar17 != 0);
      }
      uVar19 = plVar1[3];
      uVar17 = plVar1[1] + 1;
      plVar1[1] = uVar17;
      if (uVar14 < uVar19) {
        pvVar13 = (void *)plVar1[2];
LAB_0057ced5:
        *(la_int64_t *)((long)pvVar13 + uVar14 * 0x10) = lVar11;
        *(int *)((long)pvVar13 + uVar14 * 0x10 + 8) = (int)uVar17;
        plVar1[4] = uVar14 + 1;
        goto LAB_0057cef5;
      }
      lVar20 = uVar19 * 2;
      if (uVar19 < 0x200) {
        lVar20 = 0x200;
      }
      pvVar13 = realloc((void *)plVar1[2],lVar20 << 4);
      if (pvVar13 != (void *)0x0) {
        plVar1[3] = lVar20;
        plVar1[2] = (la_int64_t)pvVar13;
        uVar14 = plVar1[4];
        goto LAB_0057ced5;
      }
LAB_0057cff0:
      pcVar16 = "No memory for ino translation table";
      goto LAB_0057d0a3;
    }
    uVar17 = plVar1[1] + 1;
    plVar1[1] = uVar17;
LAB_0057cef5:
    uVar4 = (uint)uVar17;
    if ((int)uVar4 < 0) goto LAB_0057cff0;
    if (uVar4 < 0x40000) goto LAB_0057cf1c;
    pcVar16 = "Too many files for this cpio format";
    iVar18 = 0x22;
  }
  else {
    piVar8 = __errno_location();
    if (*piVar8 != 0xc) {
      pcVar16 = archive_entry_pathname(entry);
      pcVar9 = archive_string_conversion_charset_name(sc);
      archive_set_error(&a->archive,0x54,"Can\'t translate pathname \'%s\' to %s",pcVar16,pcVar9);
      local_bc = -0x14;
      goto LAB_0057cdb7;
    }
    pcVar16 = "Can\'t allocate memory for Pathname";
LAB_0057d0a3:
    iVar18 = 0xc;
  }
  archive_set_error(&a->archive,iVar18,pcVar16);
  iVar18 = -0x1e;
LAB_0057d0b7:
  archive_entry_free((archive_entry *)0x0);
  return iVar18;
}

Assistant:

static int
write_header(struct archive_write *a, struct archive_entry *entry)
{
	struct cpio *cpio;
	const char *p, *path;
	int pathlength, ret, ret_final;
	int64_t	ino;
	struct cpio_binary_header h;
	struct archive_string_conv *sconv;
	struct archive_entry *entry_main;
	size_t len;

	cpio = (struct cpio *)a->format_data;
	ret_final = ARCHIVE_OK;
	sconv = get_sconv(a);

#if defined(_WIN32) && !defined(__CYGWIN__)
	/* Make sure the path separators in pathname, hardlink and symlink
	 * are all slash '/', not the Windows path separator '\'. */
	entry_main = __la_win_entry_in_posix_pathseparator(entry);
	if (entry_main == NULL) {
		archive_set_error(&a->archive, ENOMEM,
		    "Can't allocate ustar data");
		return(ARCHIVE_FATAL);
	}
	if (entry != entry_main)
		entry = entry_main;
	else
		entry_main = NULL;
#else
	entry_main = NULL;
#endif

	ret = archive_entry_pathname_l(entry, &path, &len, sconv);
	if (ret != 0) {
		if (errno == ENOMEM) {
			archive_set_error(&a->archive, ENOMEM,
			    "Can't allocate memory for Pathname");
			ret_final = ARCHIVE_FATAL;
			goto exit_write_header;
		}
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Can't translate pathname '%s' to %s",
		    archive_entry_pathname(entry),
		    archive_string_conversion_charset_name(sconv));
		ret_final = ARCHIVE_WARN;
	}
	/* Include trailing null */
	pathlength = (int)len + 1;

	h.h_magic = la_swap16(070707);
	h.h_dev = la_swap16(archive_entry_dev(entry));

	ino = synthesize_ino_value(cpio, entry);
	if (ino < 0) {
		archive_set_error(&a->archive, ENOMEM,
		    "No memory for ino translation table");
		ret_final = ARCHIVE_FATAL;
		goto exit_write_header;
	} else if (ino > 077777) {
		archive_set_error(&a->archive, ERANGE,
		    "Too many files for this cpio format");
		ret_final = ARCHIVE_FATAL;
		goto exit_write_header;
	}
	h.h_ino = la_swap16((uint16_t)ino);

	h.h_mode = archive_entry_mode(entry);
	if (((h.h_mode & AE_IFMT) == AE_IFSOCK) || ((h.h_mode & AE_IFMT) == AE_IFIFO)) {
		archive_set_error(&a->archive, EINVAL,
				  "sockets and fifos cannot be represented in the binary cpio formats");
		ret_final = ARCHIVE_FATAL;
		goto exit_write_header;
	}
	if (a->archive.archive_format == ARCHIVE_FORMAT_CPIO_PWB) {
		if ((h.h_mode & AE_IFMT) == AE_IFLNK) {
			archive_set_error(&a->archive, EINVAL,
					  "symbolic links cannot be represented in the PWB cpio format");
			ret_final = ARCHIVE_FATAL;
			goto exit_write_header;
		}
		/* we could turn off AE_IFREG here, but it does no harm, */
		/* and allows v7 cpio to read the entry without confusion */
	}
	h.h_mode = la_swap16(h.h_mode);

	h.h_uid = la_swap16((uint16_t)archive_entry_uid(entry));
	h.h_gid = la_swap16((uint16_t)archive_entry_gid(entry));
	h.h_nlink = la_swap16((uint16_t)archive_entry_nlink(entry));

	if (archive_entry_filetype(entry) == AE_IFBLK
	    || archive_entry_filetype(entry) == AE_IFCHR)
		h.h_majmin = la_swap16(archive_entry_rdev(entry));
	else
		h.h_majmin = 0;

	h.h_mtime = la_swap32((uint32_t)archive_entry_mtime(entry));
	h.h_namesize = la_swap16(pathlength);

	/* Non-regular files don't store bodies. */
	if (archive_entry_filetype(entry) != AE_IFREG)
		archive_entry_set_size(entry, 0);

	/* Symlinks get the link written as the body of the entry. */
	ret = archive_entry_symlink_l(entry, &p, &len, sconv);
	if (ret != 0) {
		if (errno == ENOMEM) {
			archive_set_error(&a->archive, ENOMEM,
			    "Can't allocate memory for Linkname");
			ret_final = ARCHIVE_FATAL;
			goto exit_write_header;
		}
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Can't translate linkname '%s' to %s",
		    archive_entry_symlink(entry),
		    archive_string_conversion_charset_name(sconv));
		ret_final = ARCHIVE_WARN;
	}

	if (len > 0 && p != NULL  &&  *p != '\0') {
		if (a->archive.archive_format == ARCHIVE_FORMAT_CPIO_PWB) {
			archive_set_error(&a->archive, EINVAL,
					  "symlinks are not supported by UNIX V6 or by PWB cpio");
			ret_final = ARCHIVE_FATAL;
			goto exit_write_header;
		}
		h.h_filesize = la_swap32((uint32_t)strlen(p)); /* symlink */
	} else {
		if ((a->archive.archive_format == ARCHIVE_FORMAT_CPIO_PWB) &&
		    (archive_entry_size(entry) > 256*256*256-1)) {
			archive_set_error(&a->archive, ERANGE,
					  "File is too large for PWB binary cpio format.");
			ret_final = ARCHIVE_FAILED;
			goto exit_write_header;
		} else if (archive_entry_size(entry) > INT32_MAX) {
			archive_set_error(&a->archive, ERANGE,
					  "File is too large for binary cpio format.");
			ret_final = ARCHIVE_FAILED;
			goto exit_write_header;
		}
		h.h_filesize = la_swap32((uint32_t)archive_entry_size(entry)); /* file */
	}

	ret = __archive_write_output(a, &h, HSIZE);
	if (ret != ARCHIVE_OK) {
		ret_final = ARCHIVE_FATAL;
		goto exit_write_header;
	}

	ret = __archive_write_output(a, path, pathlength);
	if ((ret == ARCHIVE_OK) && ((pathlength % 2) != 0))
		ret = __archive_write_nulls(a, 1);
	if (ret != ARCHIVE_OK) {
		ret_final = ARCHIVE_FATAL;
		goto exit_write_header;
	}

	cpio->entry_bytes_remaining = archive_entry_size(entry);
	if ((cpio->entry_bytes_remaining % 2) != 0)
		cpio->entry_bytes_remaining++;

	/* Write the symlink now. */
	if (p != NULL  &&  *p != '\0') {
		ret = __archive_write_output(a, p, strlen(p));
		if ((ret == ARCHIVE_OK) && ((strlen(p) % 2) != 0))
			ret = __archive_write_nulls(a, 1);
		if (ret != ARCHIVE_OK) {
			ret_final = ARCHIVE_FATAL;
			goto exit_write_header;
		}
	}

exit_write_header:
	archive_entry_free(entry_main);
	return (ret_final);
}